

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddPriority.c
# Opt level: O3

DdNode * Cudd_bddClosestCube(DdManager *dd,DdNode *f,DdNode *g,int *distance)

{
  int *piVar1;
  DdNode *f_00;
  DdNode *f_01;
  DdNode *pDVar2;
  double rdist;
  double local_30;
  
  do {
    dd->reordered = 0;
    f_00 = cuddBddClosestCube(dd,f,g,2147483648.0);
  } while (dd->reordered == 1);
  if (f_00 != (DdNode *)0x0) {
    piVar1 = (int *)(((ulong)f_00 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    do {
      dd->reordered = 0;
      f_01 = separateCube(dd,f_00,&local_30);
    } while (dd->reordered == 1);
    if (f_01 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)f_01 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      Cudd_RecursiveDeref(dd,f_00);
      do {
        dd->reordered = 0;
        pDVar2 = cuddAddBddDoPattern(dd,f_01);
      } while (dd->reordered == 1);
      f_00 = f_01;
      if (pDVar2 != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        Cudd_RecursiveDeref(dd,f_01);
        *distance = (int)local_30;
        piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + -1;
        return pDVar2;
      }
    }
    Cudd_RecursiveDeref(dd,f_00);
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode *
Cudd_bddClosestCube(
  DdManager *dd,
  DdNode * f,
  DdNode *g,
  int *distance)
{
    DdNode *res, *acube;
    CUDD_VALUE_TYPE rdist;

    /* Compute the cube and distance as a single ADD. */
    do {
        dd->reordered = 0;
        res = cuddBddClosestCube(dd,f,g,CUDD_CONST_INDEX + 1.0);
    } while (dd->reordered == 1);
    if (res == NULL) return(NULL);
    cuddRef(res);

    /* Unpack distance and cube. */
    do {
        dd->reordered = 0;
        acube = separateCube(dd, res, &rdist);
    } while (dd->reordered == 1);
    if (acube == NULL) {
        Cudd_RecursiveDeref(dd, res);
        return(NULL);
    }
    cuddRef(acube);
    Cudd_RecursiveDeref(dd, res);

    /* Convert cube from ADD to BDD. */
    do {
        dd->reordered = 0;
        res = cuddAddBddDoPattern(dd, acube);
    } while (dd->reordered == 1);
    if (res == NULL) {
        Cudd_RecursiveDeref(dd, acube);
        return(NULL);
    }
    cuddRef(res);
    Cudd_RecursiveDeref(dd, acube);

    *distance = (int) rdist;
    cuddDeref(res);
    return(res);

}